

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O1

bool send_notification(bgp_peer *peer,int8_t error,uint16_t error_sub)

{
  int iVar1;
  bgp_notification notification;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined2 local_8;
  undefined1 local_6;
  int8_t local_5;
  undefined1 local_4;
  
  local_18 = 0xffffffff;
  uStack_14 = 0xffffffff;
  uStack_10 = 0xffffffff;
  uStack_c = 0xffffffff;
  local_8 = 0x1300;
  local_6 = 3;
  local_4 = (undefined1)(error_sub >> 8);
  local_5 = error;
  iVar1 = (**peer->_vptr_bgp_peer)(peer,&local_18,0x13);
  return SUB41(iVar1,0);
}

Assistant:

bool send_notification(bgp_peer* peer, int8_t error, uint16_t error_sub){
    bgp_notification notification;
    memset(notification.header.maker, 0xff, 16);
    notification.header.length = htons(19);
    notification.header.type = NOTIFICATION;
    notification.error = error;
    notification.error_sub = htons(error_sub);
    return peer->send(&notification, 19);
}